

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<InternalHashToName>::Append
          (ON_SimpleArray<InternalHashToName> *this,InternalHashToName *x)

{
  int iVar1;
  InternalHashToName *pIVar2;
  void *temp;
  InternalHashToName *pIStack_20;
  int newcapacity;
  InternalHashToName *p;
  InternalHashToName *x_local;
  ON_SimpleArray<InternalHashToName> *this_local;
  
  pIStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar1 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pIStack_20 = (InternalHashToName *)onmalloc(0x20);
      *(undefined8 *)(pIStack_20->m_dirty_name_hash).m_digest =
           *(undefined8 *)(x->m_dirty_name_hash).m_digest;
      *(undefined8 *)((pIStack_20->m_dirty_name_hash).m_digest + 8) =
           *(undefined8 *)((x->m_dirty_name_hash).m_digest + 8);
      *(undefined8 *)((pIStack_20->m_dirty_name_hash).m_digest + 0x10) =
           *(undefined8 *)((x->m_dirty_name_hash).m_digest + 0x10);
      pIStack_20->m_family_name = x->m_family_name;
    }
    Reserve(this,(long)iVar1);
    if (this->m_a == (InternalHashToName *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  pIVar2 = this->m_a + iVar1;
  *(undefined8 *)(pIVar2->m_dirty_name_hash).m_digest =
       *(undefined8 *)(pIStack_20->m_dirty_name_hash).m_digest;
  *(undefined8 *)((pIVar2->m_dirty_name_hash).m_digest + 8) =
       *(undefined8 *)((pIStack_20->m_dirty_name_hash).m_digest + 8);
  *(undefined8 *)((pIVar2->m_dirty_name_hash).m_digest + 0x10) =
       *(undefined8 *)((pIStack_20->m_dirty_name_hash).m_digest + 0x10);
  pIVar2->m_family_name = pIStack_20->m_family_name;
  if (pIStack_20 != x) {
    onfree(pIStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}